

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceLocation.h
# Opt level: O0

void __thiscall flow::SourceLocation::~SourceLocation(SourceLocation *this)

{
  SourceLocation *this_local;
  
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

SourceLocation() : filename(), begin(), end() {}